

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WindowLink(Select *pSel,Window *pWin)

{
  int iVar1;
  Window *pWin_local;
  Select *pSel_local;
  
  if (pSel != (Select *)0x0) {
    if ((pSel->pWin == (Window *)0x0) ||
       (iVar1 = sqlite3WindowCompare((Parse *)0x0,pSel->pWin,pWin,0), iVar1 == 0)) {
      pWin->pNextWin = pSel->pWin;
      if (pSel->pWin != (Window *)0x0) {
        pSel->pWin->ppThis = &pWin->pNextWin;
      }
      pSel->pWin = pWin;
      pWin->ppThis = &pSel->pWin;
    }
    else {
      iVar1 = sqlite3ExprListCompare(pWin->pPartition,pSel->pWin->pPartition,-1);
      if (iVar1 != 0) {
        pSel->selFlags = pSel->selFlags | 0x2000000;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowLink(Select *pSel, Window *pWin){
  if( pSel ){
    if( 0==pSel->pWin || 0==sqlite3WindowCompare(0, pSel->pWin, pWin, 0) ){
      pWin->pNextWin = pSel->pWin;
      if( pSel->pWin ){
        pSel->pWin->ppThis = &pWin->pNextWin;
      }
      pSel->pWin = pWin;
      pWin->ppThis = &pSel->pWin;
    }else{
      if( sqlite3ExprListCompare(pWin->pPartition, pSel->pWin->pPartition,-1) ){
        pSel->selFlags |= SF_MultiPart;
      }
    }
  }
}